

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles2::Functional::shaderVarValueStr_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,VarValue *value)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  uint extraout_EDX;
  uint precision;
  VarValue *extraout_RDX;
  VarValue *extraout_RDX_00;
  VarValue *value_00;
  VarValue *extraout_RDX_01;
  VarValue *extraout_RDX_02;
  VarValue *extraout_RDX_03;
  VarValue *extraout_RDX_04;
  VarValue *extraout_RDX_05;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  VarValue result_1;
  ostringstream result;
  undefined1 auStack_358 [4];
  uint local_354;
  string local_350;
  Functional *local_330;
  string *local_328;
  string local_320 [3];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  uVar4 = glu::getDataTypeScalarSize(*(DataType *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  value_00 = extraout_RDX;
  if (1 < (int)uVar4) {
    pcVar5 = glu::getDataTypeName(*(DataType *)this);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)(auStack_358 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x1b0);
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
    value_00 = extraout_RDX_00;
  }
  local_354 = uVar4;
  local_328 = __return_storage_ptr__;
  if (0 < (int)uVar4) {
    local_330 = this + 8;
    uVar9 = 0;
    do {
      precision = (uint)value_00;
      if (uVar9 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        precision = extraout_EDX;
      }
      iVar2 = *(int *)this;
      if (iVar2 - 1U < 4) {
LAB_00f9533b:
        de::floatToString_abi_cxx11_(local_320,(de *)0x2,*(float *)(this + uVar9 * 4 + 4),precision)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   (char *)CONCAT44(local_320[0]._M_dataplus._M_p._4_4_,
                                    local_320[0]._M_dataplus._M_p._0_4_),
                   CONCAT44(local_320[0]._M_string_length._4_4_,
                            (undefined4)local_320[0]._M_string_length));
        value_00 = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_320[0]._M_dataplus._M_p._4_4_,local_320[0]._M_dataplus._M_p._0_4_) !=
            &local_320[0].field_2) {
          uVar7 = CONCAT44(local_320[0].field_2._M_allocated_capacity._4_4_,
                           (undefined4)local_320[0].field_2._M_allocated_capacity);
          _Var8._M_p = (char *)CONCAT44(local_320[0]._M_dataplus._M_p._4_4_,
                                        local_320[0]._M_dataplus._M_p._0_4_);
LAB_00f95370:
          operator_delete(_Var8._M_p,uVar7 + 1);
          value_00 = extraout_RDX_02;
        }
      }
      else {
        uVar1 = iVar2 - 0x12;
        precision = CONCAT31((int3)(uVar1 >> 8),8 < uVar1);
        value_00 = (VarValue *)(ulong)precision;
        if (iVar2 - 5U < 9 || 8 >= uVar1) goto LAB_00f9533b;
        if (iVar2 - 0x1bU < 4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
          std::ostream::operator<<(local_320,*(int *)(this + uVar9 * 4 + 4));
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
          std::ios_base::~ios_base(local_2b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_350._M_dataplus._M_p,local_350._M_string_length);
          value_00 = extraout_RDX_03;
LAB_00f95458:
          uVar7 = local_350.field_2._M_allocated_capacity;
          _Var8._M_p = local_350._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p == &local_350.field_2) goto LAB_00f95378;
          goto LAB_00f95370;
        }
        if (iVar2 - 0x23U < 4) {
          pcVar5 = "false";
          if ((ulong)(byte)this[uVar9 + 4] != 0) {
            pcVar5 = "true";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,pcVar5,(ulong)(byte)this[uVar9 + 4] ^ 5);
          value_00 = extraout_RDX_04;
        }
        else if (iVar2 - 0x27U < 0x1e) {
          local_320[0]._M_dataplus._M_p._0_4_ = 4;
          local_320[0]._M_dataplus._M_p._4_4_ = (undefined4)*(undefined8 *)local_330;
          local_320[0]._M_string_length._0_4_ =
               (undefined4)((ulong)*(undefined8 *)local_330 >> 0x20);
          local_320[0]._M_string_length._4_4_ = (undefined4)*(undefined8 *)(local_330 + 8);
          local_320[0].field_2._M_allocated_capacity._0_4_ =
               (undefined4)((ulong)*(undefined8 *)(local_330 + 8) >> 0x20);
          shaderVarValueStr_abi_cxx11_(&local_350,(Functional *)local_320,value_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_350._M_dataplus._M_p,local_350._M_string_length);
          value_00 = extraout_RDX_05;
          goto LAB_00f95458;
        }
      }
LAB_00f95378:
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  psVar3 = local_328;
  if (1 < (int)local_354) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar3;
}

Assistant:

static string shaderVarValueStr (const VarValue& value)
{
	const int			numElems = glu::getDataTypeScalarSize(value.type);
	std::ostringstream	result;

	if (numElems > 1)
		result << glu::getDataTypeName(value.type) << "(";

	for (int i = 0; i < numElems; i++)
	{
		if (i > 0)
			result << ", ";

		if (glu::isDataTypeFloatOrVec(value.type) || glu::isDataTypeMatrix(value.type))
			result << de::floatToString(value.val.floatV[i], 2);
		else if (glu::isDataTypeIntOrIVec((value.type)))
			result << de::toString(value.val.intV[i]);
		else if (glu::isDataTypeBoolOrBVec((value.type)))
			result << (value.val.boolV[i] ? "true" : "false");
		else if (glu::isDataTypeSampler((value.type)))
			result << shaderVarValueStr(getSamplerFillValue(value));
		else
			DE_ASSERT(false);
	}

	if (numElems > 1)
		result << ")";

	return result.str();
}